

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Minefield_State_PDU::operator==(Minefield_State_PDU *this,Minefield_State_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Minefield_State_PDU *Value_local;
  Minefield_State_PDU *this_local;
  
  KVar1 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->m_SeqNumUnion).m_ui16SeqNum == (Value->m_SeqNumUnion).m_ui16SeqNum) {
    if (this->m_ui8ForceID == Value->m_ui8ForceID) {
      if (this->m_ui8NumPerimPoints == Value->m_ui8NumPerimPoints) {
        KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_MinefieldType,&Value->m_MinefieldType);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else if (this->m_ui16NumMineTypes == Value->m_ui16NumMineTypes) {
          KVar1 = DATA_TYPE::WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = DATA_TYPE::MinefieldAppearance::operator!=(&this->m_App,&Value->m_App);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else if ((this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 ==
                       (Value->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16) {
                bVar2 = std::operator!=(&this->m_vPoints,&Value->m_vPoints);
                if (bVar2) {
                  this_local._7_1_ = false;
                }
                else {
                  bVar2 = std::operator!=(&this->m_vMineTypes,&Value->m_vMineTypes);
                  if (bVar2) {
                    this_local._7_1_ = false;
                  }
                  else {
                    this_local._7_1_ = true;
                  }
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Minefield_State_PDU::operator == ( const Minefield_State_PDU & Value ) const
{
    if( Minefield_Header::operator != ( Value ) )                        return false;
    if( m_SeqNumUnion.m_ui16SeqNum != Value.m_SeqNumUnion.m_ui16SeqNum ) return false;
    if( m_ui8ForceID               != Value.m_ui8ForceID )               return false;
    if( m_ui8NumPerimPoints        != Value.m_ui8NumPerimPoints )        return false;
    if( m_MinefieldType            != Value.m_MinefieldType )            return false;
    if( m_ui16NumMineTypes         != Value.m_ui16NumMineTypes )         return false;
    if( m_Loc                      != Value.m_Loc )                      return false;
    if( m_Ori                      != Value.m_Ori )                      return false;
    if( m_App                      != Value.m_App )                      return false;
    if( m_ui16ProtocolModeUnion.m_ui16ProtocolMode16 != Value.m_ui16ProtocolModeUnion.m_ui16ProtocolMode16 ) return false;
    if( m_vPoints                  != Value.m_vPoints )                  return false;
    if( m_vMineTypes               != Value.m_vMineTypes )               return false;
    return true;
}